

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
PhyloTree::getIntEdgeAttribNorms
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,PhyloTree *this)

{
  PhyloTreeEdge *pPVar1;
  iterator __position;
  double in_RAX;
  PhyloTreeEdge *e;
  PhyloTreeEdge *this_00;
  double local_28;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28 = in_RAX;
  std::vector<double,_std::allocator<double>_>::reserve
            (__return_storage_ptr__,
             ((long)(this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
  pPVar1 = (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pPVar1; this_00 = this_00 + 1)
  {
    local_28 = PhyloTreeEdge::getLength(this_00);
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (__return_storage_ptr__,__position,&local_28);
    }
    else {
      *__position._M_current = local_28;
      (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> PhyloTree::getIntEdgeAttribNorms() {
    vector<double> norms;
    norms.reserve(edges.size());
    for (auto &e : edges) {
        norms.push_back(e.getLength());
    }
    return norms;
}